

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O2

void __thiscall
TasGrid::GridLocalPolynomial::addChildLimited<(TasGrid::RuleLocal::erule)3>
          (GridLocalPolynomial *this,int *point,int direction,MultiIndexSet *exclude,
          vector<int,_std::allocator<int>_> *level_limits,Data2D<int> *destination)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int point_00;
  allocator_type local_51;
  Data2D<int> *local_50;
  vector<int,_std::allocator<int>_> kid;
  
  local_50 = destination;
  ::std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)&kid,point,
             point + (this->super_BaseCanonicalGrid).num_dimensions,&local_51);
  iVar2 = 2;
LAB_001ae68e:
  do {
    iVar3 = iVar2 + -1;
    if (iVar2 == 0) {
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&kid);
      return;
    }
    point_00 = (point[direction] * 2 - (uint)(iVar2 == 2)) + 2;
    kid.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [direction] = point_00;
    iVar2 = iVar3;
  } while (point_00 == -1);
  if ((level_limits->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[direction] != -1) goto code_r0x001ae6c0;
  goto LAB_001ae6cf;
code_r0x001ae6c0:
  iVar3 = RuleLocal::getLevel<(TasGrid::RuleLocal::erule)3>(point_00);
  if (iVar3 <= (level_limits->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[direction]) {
LAB_001ae6cf:
    bVar1 = MultiIndexSet::missing(exclude,(vector<int,_std::allocator<int>_> *)&kid);
    if (bVar1) {
      Data2D<int>::appendStrip(local_50,(vector<int,_std::allocator<int>_> *)&kid);
    }
  }
  goto LAB_001ae68e;
}

Assistant:

void GridLocalPolynomial::addChildLimited(const int point[], int direction, const MultiIndexSet &exclude, const std::vector<int> &level_limits, Data2D<int> &destination) const{
    std::vector<int> kid(point, point + num_dimensions);
    int max_1d_kids = RuleLocal::getMaxNumKids<effrule>();
    for(int i=0; i<max_1d_kids; i++){
        kid[direction] = RuleLocal::getKid<effrule>(point[direction], i);
        if ((kid[direction] != -1)
            && ((level_limits[direction] == -1) || (RuleLocal::getLevel<effrule>(kid[direction]) <= level_limits[direction]))
            && exclude.missing(kid)){
            destination.appendStrip(kid);
        }
    }
}